

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

void __thiscall
pbrt::KdTreeAggregate::KdTreeAggregate
          (KdTreeAggregate *this,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *p,int isectCost,
          int traversalCost,Float emptyBonus,int maxPrims,int maxDepth)

{
  Bounds3f *nodeBounds;
  undefined8 uVar1;
  pointer pPVar2;
  unique_ptr<int[],_std::default_delete<int[]>_> __p;
  size_type __n;
  long lVar3;
  PrimitiveHandle *prim;
  pointer pPVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_000012c4 [12];
  unique_ptr<int[],_std::default_delete<int[]>_> primNums;
  unique_ptr<int[],_std::default_delete<int[]>_> prims1;
  unique_ptr<int[],_std::default_delete<int[]>_> prims0;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> edges [3];
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> primBounds;
  
  this->isectCost = isectCost;
  this->traversalCost = traversalCost;
  this->maxPrims = maxPrims;
  this->emptyBonus = emptyBonus;
  auVar9._8_4_ = 0xff7fffff;
  auVar9._0_8_ = 0xff7fffffff7fffff;
  auVar9._12_4_ = 0xff7fffff;
  pPVar4 = (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar4;
  primBounds.super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0xff7fffff7f7fffff;
  uVar1 = vmovlps_avx(auVar9);
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar1;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)uVar1 >> 0x20);
  this->nAllocedNodes = 0;
  this->nextFreeNode = 0;
  __n = (long)(this->primitives).
              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->primitives).
              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3;
  if (maxDepth < 1) {
    auVar7._0_4_ = (float)((uint)LZCOUNT(__n) ^ 0x3f);
    auVar7._4_12_ = in_register_000012c4;
    auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3fa66666),0),auVar7,ZEXT416(0x41000000));
    auVar8._8_4_ = 0x3effffff;
    auVar8._0_8_ = 0x3effffff3effffff;
    auVar8._12_4_ = 0x3effffff;
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vpternlogd_avx512vl(auVar8,auVar9,auVar6,0xf8);
    auVar9 = ZEXT416((uint)(auVar9._0_4_ + auVar6._0_4_));
    auVar9 = vroundss_avx(auVar9,auVar9,0xb);
    maxDepth = (int)auVar9._0_4_;
  }
  primBounds.super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::reserve
            (&primBounds,__n);
  pPVar2 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  nodeBounds = &this->bounds;
  for (pPVar4 = (this->primitives).
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar2; pPVar4 = pPVar4 + 1) {
    PrimitiveHandle::Bounds((Bounds3f *)edges,pPVar4);
    Union<float>((Bounds3<float> *)&prims0,nodeBounds,(Bounds3f *)edges);
    (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = local_70;
    (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fStack_6c;
    *(__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true> *)
     &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float> =
         prims0._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uStack_78;
    std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::push_back
              (&primBounds,(Bounds3f *)edges);
  }
  edges[2]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t
  .super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
  super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl =
       (__uniq_ptr_data<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>,_true,_true>)
       (__uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>)0x0;
  edges[0]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t
  .super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
  super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl =
       (__uniq_ptr_data<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>,_true,_true>)
       (__uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>)0x0;
  edges[1]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t
  .super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
  super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl =
       (__uniq_ptr_data<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>,_true,_true>)
       (__uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>)0x0;
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 8) {
    std::make_unique<pbrt::BoundEdge[]>((size_t)&prims0);
    __p = prims0;
    prims0._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
    std::__uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>::reset
              ((__uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_> *)
               ((long)&edges[0]._M_t.
                       super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                       .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + lVar5),
               (pointer)__p._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl);
    std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::~unique_ptr
              ((unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)&prims0);
  }
  std::make_unique<int[]>((size_t)&prims0);
  std::make_unique<int[]>((size_t)&prims1);
  std::make_unique<int[]>((size_t)&primNums);
  lVar3 = (long)(this->primitives).
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->primitives).
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
    *(int *)((long)primNums._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl + lVar5 * 4) = (int)lVar5;
  }
  buildTree(this,0,nodeBounds,&primBounds,
            (int *)primNums._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl,(int)lVar3,maxDepth,edges,
            (int *)prims0._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl,
            (int *)prims1._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl,0);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&primNums);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&prims1);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&prims0);
  lVar5 = 0x10;
  do {
    std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::~unique_ptr
              ((unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)
               ((long)&edges[0]._M_t.
                       super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                       .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + lVar5));
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  std::_Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::~_Vector_base
            (&primBounds.
              super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>);
  return;
}

Assistant:

KdTreeAggregate::KdTreeAggregate(std::vector<PrimitiveHandle> p, int isectCost,
                                 int traversalCost, Float emptyBonus, int maxPrims,
                                 int maxDepth)
    : isectCost(isectCost),
      traversalCost(traversalCost),
      maxPrims(maxPrims),
      emptyBonus(emptyBonus),
      primitives(std::move(p)) {
    // Build kd-tree for accelerator
    nextFreeNode = nAllocedNodes = 0;
    if (maxDepth <= 0)
        maxDepth = std::round(8 + 1.3f * Log2Int(int64_t(primitives.size())));
    // Compute bounds for kd-tree construction
    std::vector<Bounds3f> primBounds;
    primBounds.reserve(primitives.size());
    for (PrimitiveHandle &prim : primitives) {
        Bounds3f b = prim.Bounds();
        bounds = Union(bounds, b);
        primBounds.push_back(b);
    }

    // Allocate working memory for kd-tree construction
    std::unique_ptr<BoundEdge[]> edges[3];
    for (int i = 0; i < 3; ++i)
        edges[i] = std::make_unique<BoundEdge[]>(2 * primitives.size());

    std::unique_ptr<int[]> prims0 = std::make_unique<int[]>(primitives.size());
    std::unique_ptr<int[]> prims1 =
        std::make_unique<int[]>((maxDepth + 1) * primitives.size());

    // Initialize _primNums_ for kd-tree construction
    std::unique_ptr<int[]> primNums = std::make_unique<int[]>(primitives.size());
    for (size_t i = 0; i < primitives.size(); ++i)
        primNums[i] = i;

    // Start recursive construction of kd-tree
    buildTree(0, bounds, primBounds, primNums.get(), primitives.size(), maxDepth, edges,
              prims0.get(), prims1.get(), 0);
}